

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

CompilerHLSL * __thiscall
spirv_cross::CompilerHLSL::bitcast_glsl_op_abi_cxx11_
          (CompilerHLSL *this,SPIRType *out_type,SPIRType *in_type)

{
  CompilerError *pCVar1;
  long in_RCX;
  allocator local_8f;
  allocator local_8e;
  allocator local_8d;
  allocator local_8c;
  allocator local_8b;
  undefined1 local_8a;
  allocator local_89;
  string local_88 [38];
  undefined1 local_62;
  allocator local_61;
  string local_60 [33];
  allocator local_3f;
  allocator local_3e;
  allocator local_3d [20];
  allocator local_29 [9];
  SPIRType *in_type_local;
  SPIRType *out_type_local;
  CompilerHLSL *this_local;
  
  in_type_local = in_type;
  out_type_local = out_type;
  this_local = this;
  if ((*(int *)&(in_type->super_IVariant).field_0xc == 8) && (*(int *)(in_RCX + 0xc) == 7)) {
    (*(out_type->super_IVariant)._vptr_IVariant[0x13])(this,out_type,in_type,0);
  }
  else if ((*(int *)&(in_type->super_IVariant).field_0xc == 10) && (*(int *)(in_RCX + 0xc) == 9)) {
    (*(out_type->super_IVariant)._vptr_IVariant[0x13])(this,out_type,in_type,0);
  }
  else if ((*(int *)&(in_type->super_IVariant).field_0xc == 8) && (*(int *)(in_RCX + 0xc) == 0xd)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"asuint",local_29);
    ::std::allocator<char>::~allocator((allocator<char> *)local_29);
  }
  else if ((*(int *)&(in_type->super_IVariant).field_0xc == 7) && (*(int *)(in_RCX + 0xc) == 8)) {
    (*(out_type->super_IVariant)._vptr_IVariant[0x13])(this,out_type,in_type,0);
  }
  else if ((*(int *)&(in_type->super_IVariant).field_0xc == 9) && (*(int *)(in_RCX + 0xc) == 10)) {
    (*(out_type->super_IVariant)._vptr_IVariant[0x13])(this,out_type,in_type,0);
  }
  else if ((*(int *)&(in_type->super_IVariant).field_0xc == 7) && (*(int *)(in_RCX + 0xc) == 0xd)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"asint",local_3d);
    ::std::allocator<char>::~allocator((allocator<char> *)local_3d);
  }
  else if ((*(int *)&(in_type->super_IVariant).field_0xc == 0xd) && (*(int *)(in_RCX + 0xc) == 8)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"asfloat",&local_3e);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3e);
  }
  else if ((*(int *)&(in_type->super_IVariant).field_0xc == 0xd) && (*(int *)(in_RCX + 0xc) == 7)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"asfloat",&local_3f);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3f);
  }
  else {
    if ((*(int *)&(in_type->super_IVariant).field_0xc == 9) && (*(int *)(in_RCX + 0xc) == 0xe)) {
      local_62 = 1;
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_60,"Double to Int64 is not supported in HLSL.",&local_61)
      ;
      CompilerError::CompilerError(pCVar1,(string *)local_60);
      local_62 = 0;
      __cxa_throw(pCVar1,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((*(int *)&(in_type->super_IVariant).field_0xc == 10) && (*(int *)(in_RCX + 0xc) == 0xe)) {
      local_8a = 1;
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_88,"Double to UInt64 is not supported in HLSL.",&local_89);
      CompilerError::CompilerError(pCVar1,(string *)local_88);
      local_8a = 0;
      __cxa_throw(pCVar1,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((*(int *)&(in_type->super_IVariant).field_0xc == 0xe) && (*(int *)(in_RCX + 0xc) == 9)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"asdouble",&local_8b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_8b);
    }
    else if ((*(int *)&(in_type->super_IVariant).field_0xc == 0xe) && (*(int *)(in_RCX + 0xc) == 10)
            ) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"asdouble",&local_8c);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_8c);
    }
    else if (((*(int *)&(in_type->super_IVariant).field_0xc == 0xc) && (*(int *)(in_RCX + 0xc) == 8)
             ) && (*(int *)(in_RCX + 0x14) == 1)) {
      if ((out_type[0x1b].member_types.stack_storage.aligned_char[0x1b] & 1U) == 0) {
        out_type[0x1b].member_types.stack_storage.aligned_char[0x1b] = '\x01';
        Compiler::force_recompile((Compiler *)out_type);
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"SPIRV_Cross_unpackFloat2x16",&local_8d);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_8d);
    }
    else if (((*(int *)&(in_type->super_IVariant).field_0xc == 8) && (*(int *)(in_RCX + 0xc) == 0xc)
             ) && (*(int *)(in_RCX + 0x14) == 2)) {
      if ((out_type[0x1b].member_types.stack_storage.aligned_char[0x1b] & 1U) == 0) {
        out_type[0x1b].member_types.stack_storage.aligned_char[0x1b] = '\x01';
        Compiler::force_recompile((Compiler *)out_type);
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"SPIRV_Cross_packFloat2x16",&local_8e);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_8e);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"",&local_8f);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_8f);
    }
  }
  return this;
}

Assistant:

string CompilerHLSL::bitcast_glsl_op(const SPIRType &out_type, const SPIRType &in_type)
{
	if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::Int)
		return type_to_glsl(out_type);
	else if (out_type.basetype == SPIRType::UInt64 && in_type.basetype == SPIRType::Int64)
		return type_to_glsl(out_type);
	else if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::Float)
		return "asuint";
	else if (out_type.basetype == SPIRType::Int && in_type.basetype == SPIRType::UInt)
		return type_to_glsl(out_type);
	else if (out_type.basetype == SPIRType::Int64 && in_type.basetype == SPIRType::UInt64)
		return type_to_glsl(out_type);
	else if (out_type.basetype == SPIRType::Int && in_type.basetype == SPIRType::Float)
		return "asint";
	else if (out_type.basetype == SPIRType::Float && in_type.basetype == SPIRType::UInt)
		return "asfloat";
	else if (out_type.basetype == SPIRType::Float && in_type.basetype == SPIRType::Int)
		return "asfloat";
	else if (out_type.basetype == SPIRType::Int64 && in_type.basetype == SPIRType::Double)
		SPIRV_CROSS_THROW("Double to Int64 is not supported in HLSL.");
	else if (out_type.basetype == SPIRType::UInt64 && in_type.basetype == SPIRType::Double)
		SPIRV_CROSS_THROW("Double to UInt64 is not supported in HLSL.");
	else if (out_type.basetype == SPIRType::Double && in_type.basetype == SPIRType::Int64)
		return "asdouble";
	else if (out_type.basetype == SPIRType::Double && in_type.basetype == SPIRType::UInt64)
		return "asdouble";
	else if (out_type.basetype == SPIRType::Half && in_type.basetype == SPIRType::UInt && in_type.vecsize == 1)
	{
		if (!requires_explicit_fp16_packing)
		{
			requires_explicit_fp16_packing = true;
			force_recompile();
		}
		return "SPIRV_Cross_unpackFloat2x16";
	}
	else if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::Half && in_type.vecsize == 2)
	{
		if (!requires_explicit_fp16_packing)
		{
			requires_explicit_fp16_packing = true;
			force_recompile();
		}
		return "SPIRV_Cross_packFloat2x16";
	}
	else
		return "";
}